

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

string * __thiscall
pfederc::UnOpExpr::toString_abi_cxx11_(string *__return_storage_ptr__,UnOpExpr *this)

{
  Token *pTVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pTVar1 = this->tokOp;
  if (pTVar1->type == TOK_OP_BRACKET_OPEN) {
    (*((this->expr)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_98);
    std::operator+(&bStack_b8,'(',&local_98);
    std::operator+(__return_storage_ptr__,&bStack_b8,')');
    std::__cxx11::string::~string((string *)&bStack_b8);
    this_00 = &local_98;
  }
  else {
    (*pTVar1->_vptr_Token[2])(&local_38,pTVar1,(this->super_Expr).lexer);
    std::operator+(&local_78,'(',&local_38);
    std::operator+(&local_98,&local_78,' ');
    (*((this->expr)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_58);
    std::operator+(&bStack_b8,&local_98,&local_58);
    std::operator+(__return_storage_ptr__,&bStack_b8,')');
    std::__cxx11::string::~string((string *)&bStack_b8);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    this_00 = &local_38;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string UnOpExpr::toString() const noexcept {
  if (getOperatorType() == TokenType::TOK_OP_BRACKET_OPEN) {
    return '(' + getExpression().toString() + ')';
  }

  return '(' + getOperatorToken().toString(getLexer()) +
    ' ' + getExpression().toString() + ')';
}